

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeKHR
          (Builder *this,Id component,Id scope,Id rows,Id cols,Id use)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  pointer *ppuVar1;
  ulong uVar2;
  pointer puVar3;
  iterator __position;
  bool bVar4;
  Builder *this_01;
  Id IVar5;
  uint uVar6;
  mapped_type *pmVar7;
  Instruction *pIVar8;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_02;
  char *pcVar9;
  long *plVar10;
  undefined8 *puVar11;
  mapped_type_conflict *pmVar12;
  int iVar13;
  long lVar14;
  long *plVar15;
  _Bit_pointer puVar16;
  long lVar17;
  Instruction *type;
  string debugName;
  anon_class_8_1_8991fb9c findName;
  Instruction *local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  long lStack_e0;
  uint local_d0;
  uint local_cc;
  allocator<char> local_c5;
  uint local_c4;
  long *local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 uStack_a8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a0 [2];
  undefined1 local_90 [16];
  anon_class_8_1_8991fb9c local_80;
  _Bit_pointer *local_78;
  pointer local_70;
  _Bit_pointer local_68 [2];
  Builder *local_58;
  _Bit_pointer *local_50;
  long local_48;
  _Bit_pointer local_40 [2];
  
  this_00 = &this->groupedTypes;
  local_a0[0]._M_head_impl._0_4_ = 0x1168;
  local_d0 = cols;
  local_cc = rows;
  local_c4 = use;
  local_58 = this;
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)local_a0);
  iVar13 = (int)((ulong)((long)(pmVar7->
                               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pmVar7->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar4 = 0 < iVar13;
  if (0 < iVar13) {
    lVar17 = 0;
    do {
      local_a0[0]._M_head_impl._0_4_ = 0x1168;
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)local_a0);
      local_100 = (pmVar7->
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar17];
      uVar2 = *(local_100->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((uVar2 & 1) == 0) {
LAB_0045c526:
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      puVar3 = (local_100->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*puVar3 == component) {
        if ((uVar2 & 2) == 0) goto LAB_0045c526;
        if (puVar3[1] == scope) {
          if ((uVar2 & 4) == 0) goto LAB_0045c526;
          if (puVar3[2] == local_cc) {
            if ((uVar2 & 8) == 0) goto LAB_0045c526;
            if (puVar3[3] == local_d0) {
              if ((uVar2 & 0x10) == 0) goto LAB_0045c526;
              if (puVar3[4] == local_c4) {
                pmVar7 = (mapped_type *)(ulong)local_100->resultId;
                break;
              }
            }
          }
        }
      }
      lVar17 = lVar17 + 1;
      local_a0[0]._M_head_impl._0_4_ = 0x1168;
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)local_a0);
      lVar14 = (long)(int)((ulong)((long)(pmVar7->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pmVar7->
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3);
      bVar4 = lVar17 < lVar14;
    } while (lVar17 < lVar14);
  }
  if (bVar4) {
    return (Id)pmVar7;
  }
  pIVar8 = (Instruction *)operator_new(0x60);
  this_01 = local_58;
  IVar5 = local_58->uniqueId + 1;
  local_58->uniqueId = IVar5;
  pIVar8->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  pIVar8->resultId = IVar5;
  pIVar8->typeId = 0;
  pIVar8->opCode = OpTypeCooperativeMatrixKHR;
  (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar8->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar8->block = (Block *)0x0;
  local_100 = pIVar8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar8->operands,5);
  if ((pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar8->idOperand,5);
  }
  Instruction::addIdOperand(local_100,component);
  Instruction::addIdOperand(local_100,scope);
  Instruction::addIdOperand(local_100,local_cc);
  Instruction::addIdOperand(local_100,local_d0);
  Instruction::addIdOperand(local_100,local_c4);
  local_a0[0]._M_head_impl._0_4_ = 0x1168;
  this_02 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)local_a0);
  __position._M_current = *(Instruction ***)(this_02 + 8);
  if (__position._M_current == *(Instruction ***)(this_02 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_02,__position,&local_100);
  }
  else {
    *__position._M_current = local_100;
    *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
  }
  local_a0[0]._M_head_impl = local_100;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this_01->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)local_a0);
  if (local_a0[0]._M_head_impl != (Instruction *)0x0) {
    (*(local_a0[0]._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this_01->module,local_100);
  if (this_01->emitNonSemanticShaderDebugInfo != true) goto LAB_0045c50c;
  local_80.this = this_01;
  local_a0[0]._M_head_impl = (Instruction *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"coopmat<","");
  pcVar9 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&local_80,component);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pcVar9,(allocator<char> *)&local_78);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
  ppuVar1 = &local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar15 = plVar10 + 2;
  if ((pointer *)*plVar10 == (pointer *)plVar15) {
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    lStack_e0 = plVar10[3];
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
  }
  else {
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar10;
  }
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar10[1];
  *plVar10 = (long)plVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)local_a0,
             (ulong)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  if ((pointer *)
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((this_01->module).idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[scope]->opCode == OpConstant) {
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"gl_Scope","");
    uVar6 = getConstantScalar(this_01,scope);
    if (uVar6 < 7) {
      pcVar9 = &DAT_0086a81c + *(int *)(&DAT_0086a81c + (ulong)uVar6 * 4);
    }
    else {
      pcVar9 = "Unknown";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar9,&local_c5);
    puVar16 = (_Bit_pointer)0xf;
    if (local_78 != local_68) {
      puVar16 = local_68[0];
    }
    if (puVar16 < (_Bit_pointer)(local_48 + (long)local_70)) {
      puVar16 = (_Bit_pointer)0xf;
      if (local_50 != local_40) {
        puVar16 = local_40[0];
      }
      if (puVar16 < (_Bit_pointer)(local_48 + (long)local_70)) goto LAB_0045c174;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_78);
    }
    else {
LAB_0045c174:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50);
    }
    plVar10 = puVar11 + 2;
    if ((long *)*puVar11 == plVar10) {
      local_b0 = *plVar10;
      uStack_a8 = puVar11[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar10;
      local_c0 = (long *)*puVar11;
    }
    local_b8 = puVar11[1];
    *puVar11 = plVar10;
    puVar11[1] = 0;
    *(undefined1 *)plVar10 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
    plVar15 = plVar10 + 2;
    if ((pointer *)*plVar10 == (pointer *)plVar15) {
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
      lStack_e0 = plVar10[3];
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
    }
    else {
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar10;
    }
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)local_a0,
               (ulong)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if ((pointer *)
        local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,(long)local_40[0] + 1);
    }
    if (local_78 != local_68) {
      operator_delete(local_78,(long)local_68[0] + 1);
    }
  }
  else {
    pcVar9 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&local_80,scope);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,pcVar9,(allocator<char> *)&local_78);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
    plVar15 = plVar10 + 2;
    if ((pointer *)*plVar10 == (pointer *)plVar15) {
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
      lStack_e0 = plVar10[3];
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
    }
    else {
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar10;
    }
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)local_a0,
               (ulong)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if ((pointer *)
        local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
  }
  pcVar9 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&local_80,local_cc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pcVar9,(allocator<char> *)&local_78);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar15 = plVar10 + 2;
  if ((pointer *)*plVar10 == (pointer *)plVar15) {
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    lStack_e0 = plVar10[3];
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
  }
  else {
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar10;
  }
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar10[1];
  *plVar10 = (long)plVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)local_a0,
             (ulong)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  if ((pointer *)
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  pcVar9 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&local_80,local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pcVar9,(allocator<char> *)&local_78);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar15 = plVar10 + 2;
  if ((pointer *)*plVar10 == (pointer *)plVar15) {
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    lStack_e0 = plVar10[3];
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
  }
  else {
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar15;
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar10;
  }
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar10[1];
  *plVar10 = (long)plVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)local_a0,
             (ulong)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  if ((pointer *)
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IVar5 = makeCompositeDebugType
                    (this_01,&local_f8,(char *)local_a0[0]._M_head_impl,
                     NonSemanticShaderDebugInfo100Structure,true);
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,local_100->resultId);
  pmVar12 = std::
            map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::operator[](&this_01->debugId,(key_type_conflict *)&local_f8);
  *pmVar12 = IVar5;
  if (local_a0[0]._M_head_impl != (Instruction *)local_90) {
    operator_delete(local_a0[0]._M_head_impl,local_90._0_8_ + 1);
  }
LAB_0045c50c:
  return local_100->resultId;
}

Assistant:

Id Builder::makeCooperativeMatrixTypeKHR(Id component, Id scope, Id rows, Id cols, Id use)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeCooperativeMatrixKHR].size(); ++t) {
        type = groupedTypes[OpTypeCooperativeMatrixKHR][t];
        if (type->getIdOperand(0) == component &&
            type->getIdOperand(1) == scope &&
            type->getIdOperand(2) == rows &&
            type->getIdOperand(3) == cols &&
            type->getIdOperand(4) == use)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeCooperativeMatrixKHR);
    type->reserveOperands(5);
    type->addIdOperand(component);
    type->addIdOperand(scope);
    type->addIdOperand(rows);
    type->addIdOperand(cols);
    type->addIdOperand(use);
    groupedTypes[OpTypeCooperativeMatrixKHR].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        // Find a name for one of the parameters. It can either come from debuginfo for another
        // type, or an OpName from a constant.
        auto const findName = [&](Id id) {
            Id id2 = debugId[id];
            for (auto &t : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic]) {
                if (t->getResultId() == id2) {
                    for (auto &s : strings) {
                        if (s->getResultId() == t->getIdOperand(2)) {
                            return s->getNameString();
                        }
                    }
                }
            }
            for (auto &t : names) {
                if (t->getIdOperand(0) == id) {
                    return t->getNameString();
                }
            }
            return "unknown";
        };
        std::string debugName = "coopmat<";
        debugName += std::string(findName(component)) + ", ";
        if (isConstantScalar(scope)) {
            debugName += std::string("gl_Scope") + std::string(spv::ScopeToString((spv::Scope)getConstantScalar(scope))) + ", ";
        } else {
            debugName += std::string(findName(scope)) + ", ";
        }
        debugName += std::string(findName(rows)) + ", ";
        debugName += std::string(findName(cols)) + ">";
        // There's no nonsemantic debug info instruction for cooperative matrix types,
        // use opaque composite instead.
        auto const debugResultId = makeCompositeDebugType({}, debugName.c_str(), NonSemanticShaderDebugInfo100Structure, true);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}